

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_randomizer(void)

{
  int local_c;
  wchar_t i;
  
  wr_u32b(Rand_value);
  wr_u32b(state_i);
  wr_u32b(z0);
  wr_u32b(z1);
  wr_u32b(z2);
  for (local_c = 0; local_c < 0x20; local_c = local_c + 1) {
    wr_u32b(STATE[local_c]);
  }
  for (local_c = 0; local_c < 0x1b; local_c = local_c + 1) {
    wr_u32b(0);
  }
  return;
}

Assistant:

void wr_randomizer(void)
{
	int i;

	/* current value for the simple RNG */
	wr_u32b(Rand_value);

	/* state index */
	wr_u32b(state_i);

	/* RNG variables */
	wr_u32b(z0);
	wr_u32b(z1);
	wr_u32b(z2);

	/* RNG state */
	for (i = 0; i < RAND_DEG; i++)
		wr_u32b(STATE[i]);

	/* NULL padding */
	for (i = 0; i < 59 - RAND_DEG; i++)
		wr_u32b(0);
}